

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

WriteBatch * __thiscall leveldb::DBImpl::BuildBatchGroup(DBImpl *this,Writer **last_writer)

{
  Writer *pWVar1;
  Writer *pWVar2;
  ulong uVar3;
  _Elt_pointer ppWVar4;
  _Elt_pointer ppWVar5;
  WriteBatch *src;
  ulong uVar6;
  WriteBatch *dst;
  _Map_pointer local_50;
  
  pWVar1 = *(this->writers_).
            super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  dst = pWVar1->batch;
  uVar6 = (dst->rep_)._M_string_length;
  uVar3 = 0x100000;
  if (uVar6 < 0x20001) {
    uVar3 = uVar6 + 0x20000;
  }
  *last_writer = pWVar1;
  ppWVar4 = (this->writers_).
            super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_50 = (this->writers_).
             super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
  ppWVar5 = (this->writers_).
            super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
  if (ppWVar5 == ppWVar4) {
    ppWVar5 = local_50[1];
    local_50 = local_50 + 1;
    ppWVar4 = ppWVar5 + 0x40;
  }
  while( true ) {
    if (ppWVar5 ==
        (this->writers_).
        super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur) {
      return dst;
    }
    pWVar2 = *ppWVar5;
    if ((pWVar2->sync == true) && (pWVar1->sync != true)) break;
    src = pWVar2->batch;
    if (src != (WriteBatch *)0x0) {
      uVar6 = uVar6 + (src->rep_)._M_string_length;
      if (uVar3 < uVar6) {
        return dst;
      }
      if (dst == pWVar1->batch) {
        dst = this->tmp_batch_;
        WriteBatchInternal::Append(dst,pWVar1->batch);
        src = pWVar2->batch;
      }
      WriteBatchInternal::Append(dst,src);
    }
    *last_writer = pWVar2;
    ppWVar5 = ppWVar5 + 1;
    if (ppWVar5 == ppWVar4) {
      ppWVar5 = local_50[1];
      local_50 = local_50 + 1;
      ppWVar4 = ppWVar5 + 0x40;
    }
  }
  return dst;
}

Assistant:

WriteBatch* DBImpl::BuildBatchGroup(Writer** last_writer) {
  mutex_.AssertHeld();
  assert(!writers_.empty());
  Writer* first = writers_.front();
  WriteBatch* result = first->batch;
  assert(result != nullptr);

  size_t size = WriteBatchInternal::ByteSize(first->batch);

  // Allow the group to grow up to a maximum size, but if the
  // original write is small, limit the growth so we do not slow
  // down the small write too much.
  size_t max_size = 1 << 20;
  if (size <= (128 << 10)) {
    max_size = size + (128 << 10);
  }

  *last_writer = first;
  std::deque<Writer*>::iterator iter = writers_.begin();
  ++iter;  // Advance past "first"
  for (; iter != writers_.end(); ++iter) {
    Writer* w = *iter;
    if (w->sync && !first->sync) {
      // Do not include a sync write into a batch handled by a non-sync write.
      break;
    }

    if (w->batch != nullptr) {
      size += WriteBatchInternal::ByteSize(w->batch);
      if (size > max_size) {
        // Do not make batch too big
        break;
      }

      // Append to *result
      if (result == first->batch) {
        // Switch to temporary batch instead of disturbing caller's batch
        result = tmp_batch_;
        assert(WriteBatchInternal::Count(result) == 0);
        WriteBatchInternal::Append(result, first->batch);
      }
      WriteBatchInternal::Append(result, w->batch);
    }
    *last_writer = w;
  }
  return result;
}